

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int __thiscall ncnn::BinaryOp::forward_inplace(BinaryOp *this,Mat *bottom_top_blob,Option *opt)

{
  long in_RDI;
  Option *in_stack_00000040;
  float in_stack_0000004c;
  Mat *in_stack_00000050;
  undefined4 local_4;
  
  if (*(int *)(in_RDI + 0x80) == 0) {
    local_4 = binary_op_scalar_inplace<std::plus<float>>
                        (in_stack_00000050,in_stack_0000004c,in_stack_00000040);
  }
  else if (*(int *)(in_RDI + 0x80) == 1) {
    local_4 = binary_op_scalar_inplace<std::minus<float>>
                        (in_stack_00000050,in_stack_0000004c,in_stack_00000040);
  }
  else if (*(int *)(in_RDI + 0x80) == 2) {
    local_4 = binary_op_scalar_inplace<std::multiplies<float>>
                        (in_stack_00000050,in_stack_0000004c,in_stack_00000040);
  }
  else if (*(int *)(in_RDI + 0x80) == 3) {
    local_4 = binary_op_scalar_inplace<std::divides<float>>
                        (in_stack_00000050,in_stack_0000004c,in_stack_00000040);
  }
  else if (*(int *)(in_RDI + 0x80) == 4) {
    local_4 = binary_op_scalar_inplace<ncnn::binary_op_max<float>>
                        (in_stack_00000050,in_stack_0000004c,in_stack_00000040);
  }
  else if (*(int *)(in_RDI + 0x80) == 5) {
    local_4 = binary_op_scalar_inplace<ncnn::binary_op_min<float>>
                        (in_stack_00000050,in_stack_0000004c,in_stack_00000040);
  }
  else if (*(int *)(in_RDI + 0x80) == 6) {
    local_4 = binary_op_scalar_inplace<ncnn::binary_op_pow<float>>
                        (in_stack_00000050,in_stack_0000004c,in_stack_00000040);
  }
  else if (*(int *)(in_RDI + 0x80) == 7) {
    local_4 = binary_op_scalar_inplace<ncnn::binary_op_rsub<float>>
                        (in_stack_00000050,in_stack_0000004c,in_stack_00000040);
  }
  else if (*(int *)(in_RDI + 0x80) == 8) {
    local_4 = binary_op_scalar_inplace<ncnn::binary_op_rdiv<float>>
                        (in_stack_00000050,in_stack_0000004c,in_stack_00000040);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int BinaryOp::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (op_type == Operation_ADD)
        return binary_op_scalar_inplace< std::plus<float> >(bottom_top_blob, b, opt);

    if (op_type == Operation_SUB)
        return binary_op_scalar_inplace< std::minus<float> >(bottom_top_blob, b, opt);

    if (op_type == Operation_MUL)
        return binary_op_scalar_inplace< std::multiplies<float> >(bottom_top_blob, b, opt);

    if (op_type == Operation_DIV)
        return binary_op_scalar_inplace< std::divides<float> >(bottom_top_blob, b, opt);

    if (op_type == Operation_MAX)
        return binary_op_scalar_inplace< binary_op_max<float> >(bottom_top_blob, b, opt);

    if (op_type == Operation_MIN)
        return binary_op_scalar_inplace< binary_op_min<float> >(bottom_top_blob, b, opt);

    if (op_type == Operation_POW)
        return binary_op_scalar_inplace< binary_op_pow<float> >(bottom_top_blob, b, opt);

    if (op_type == Operation_RSUB)
        return binary_op_scalar_inplace< binary_op_rsub<float> >(bottom_top_blob, b, opt);

    if (op_type == Operation_RDIV)
        return binary_op_scalar_inplace< binary_op_rdiv<float> >(bottom_top_blob, b, opt);

    return 0;
}